

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  float value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uint uVar2;
  uint32_t c;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t x;
  uint uVar6;
  uint uVar7;
  float *__dest;
  uint uVar8;
  uint16_t outValue;
  uint16_t local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  ulong local_40;
  ImageT<float,_4U> *local_38;
  
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar8 = targetBits >> 3;
  local_4c = numChannels;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar8 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_4d);
  uVar4 = (ulong)local_4c;
  pvVar1 = local_48;
  uVar2 = local_4c;
  local_40 = uVar4;
  local_38 = this;
  for (uVar5 = 0; uVar5 < (this->super_Image).height; uVar5 = uVar5 + 1) {
    for (uVar6 = 0; uVar6 < (this->super_Image).width; uVar6 = uVar6 + 1) {
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        uVar7 = (this->super_Image).width * uVar5 + uVar6;
        value = this->pixels[uVar7].field_0.comps[uVar3];
        __dest = (float *)((pvVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start +
                          (uVar7 * uVar2 + (int)uVar3) * uVar8);
        if (targetBits == 0x10) {
          local_50 = imageio::float_to_half(value);
          memcpy(__dest,&local_50,(ulong)uVar8);
          pvVar1 = local_48;
          uVar4 = local_40;
          this = local_38;
          uVar2 = local_4c;
        }
        else if (targetBits == 0x20) {
          *__dest = value;
        }
      }
    }
  }
  return pvVar1;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }